

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O2

bool CoreML::Specification::operator==(Imputer *a,Imputer *b)

{
  double dVar1;
  double dVar2;
  uint32 uVar3;
  bool bVar4;
  DoubleVector *a_00;
  DoubleVector *b_00;
  Int64ToDoubleMap *a_01;
  Int64ToDoubleMap *b_01;
  Int64Vector *a_02;
  Int64Vector *b_02;
  StringToDoubleMap *a_03;
  StringToDoubleMap *b_03;
  ReplaceValueUnion __rhs;
  ReplaceValueUnion __lhs;
  
  if (a->_oneof_case_[0] != b->_oneof_case_[0]) {
    return false;
  }
  switch(a->_oneof_case_[0]) {
  case 0:
    goto LAB_00581852;
  case 1:
    if ((a->ImputedValue_).imputeddoublevalue_ != (b->ImputedValue_).imputeddoublevalue_) {
      return false;
    }
    if (NAN((a->ImputedValue_).imputeddoublevalue_) || NAN((b->ImputedValue_).imputeddoublevalue_))
    {
      return false;
    }
    goto switchD_005816fe_default;
  case 2:
    if ((a->ImputedValue_).imputedint64value_ != (b->ImputedValue_).imputedint64value_) {
      return false;
    }
    goto switchD_005816fe_default;
  case 3:
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (a->ImputedValue_).imputeddoublearray_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (b->ImputedValue_).imputeddoublearray_);
    break;
  case 4:
    a_00 = Imputer::imputeddoublearray(a);
    b_00 = Imputer::imputeddoublearray(b);
    bVar4 = vectorsEqual<CoreML::Specification::DoubleVector>(a_00,b_00);
    break;
  case 5:
    a_02 = Imputer::imputedint64array(a);
    b_02 = Imputer::imputedint64array(b);
    bVar4 = vectorsEqual<CoreML::Specification::Int64Vector>(a_02,b_02);
    break;
  case 6:
    a_03 = Imputer::imputedstringdictionary(a);
    b_03 = Imputer::imputedstringdictionary(b);
    bVar4 = mapsEqual<CoreML::Specification::StringToDoubleMap>(a_03,b_03);
    if (bVar4) {
      return true;
    }
    return false;
  case 7:
    a_01 = Imputer::imputedint64dictionary(a);
    b_01 = Imputer::imputedint64dictionary(b);
    bVar4 = mapsEqual<CoreML::Specification::Int64ToDoubleMap>(a_01,b_01);
    break;
  default:
    goto switchD_005816fe_default;
  }
  if (bVar4 != false) {
switchD_005816fe_default:
    uVar3 = a->_oneof_case_[1];
    if (uVar3 == b->_oneof_case_[1]) {
      if (uVar3 == 0xb) {
        dVar1 = (a->ReplaceValue_).replacedoublevalue_;
        dVar2 = (b->ReplaceValue_).replacedoublevalue_;
        if (!NAN(dVar2) || !NAN(dVar1)) {
          if (dVar1 != dVar2) {
            return false;
          }
          if (NAN(dVar1) || NAN(dVar2)) {
            return false;
          }
        }
      }
      else {
        if (uVar3 == 0xc) {
          __lhs = (ReplaceValueUnion)(a->ReplaceValue_).replaceint64value_;
          __rhs = (ReplaceValueUnion)(b->ReplaceValue_).replaceint64value_;
          if (__lhs.replaceint64value_ != __rhs.replaceint64value_) {
            return false;
          }
        }
        else {
          if (uVar3 != 0xd) {
            return true;
          }
          __lhs = a->ReplaceValue_;
          __rhs = b->ReplaceValue_;
        }
        if (uVar3 != 0xd) {
          __lhs = (ReplaceValueUnion)
                  &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
          __rhs = (ReplaceValueUnion)
                  &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
        }
        bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs);
        if (bVar4) {
          return false;
        }
      }
LAB_00581852:
      return true;
    }
  }
  return false;
}

Assistant:

inline Imputer::ReplaceValueCase Imputer::ReplaceValue_case() const {
  return Imputer::ReplaceValueCase(_oneof_case_[1]);
}